

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O2

Offset<void> __thiscall
UnionUnderlyingType::ABCUnion::Pack
          (ABCUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  ABC AVar1;
  Offset<UnionUnderlyingType::A> OVar2;
  Offset<UnionUnderlyingType::B> OVar3;
  Offset<UnionUnderlyingType::C> OVar4;
  
  AVar1 = this->type;
  if (AVar1 == C) {
    OVar4 = CreateC(_fbb,*this->value);
    return (Offset<void>)OVar4.o;
  }
  if (AVar1 != B) {
    if (AVar1 == A) {
      OVar2 = CreateA(_fbb,*this->value);
      return (Offset<void>)OVar2.o;
    }
    return (Offset<void>)0;
  }
  OVar3 = CreateB(_fbb,(BT *)this->value,_rehasher);
  return (Offset<void>)OVar3.o;
}

Assistant:

inline ::flatbuffers::Offset<void> ABCUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::AT *>(value);
      return CreateA(_fbb, ptr, _rehasher).Union();
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::BT *>(value);
      return CreateB(_fbb, ptr, _rehasher).Union();
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::CT *>(value);
      return CreateC(_fbb, ptr, _rehasher).Union();
    }
    default: return 0;
  }
}